

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_group.cpp
# Opt level: O2

void __thiscall mpt::item_group::bind(item_group *this)

{
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  
  bind((item_group *)&this[-1]._items,in_ESI,in_RDX,in_ECX);
  return;
}

Assistant:

int item_group::bind(const relation *from, logger *out)
{
	int count = 0;
	for (auto &it : _items) {
		metatype *curr;
		group *g;
		if (!(curr = it.instance()) || !(g = *curr)) {
			continue;
		}
		int ret;
		collection::relation rel(*g, from);
		if ((ret = g->bind(&rel, out)) < 0) {
			return ret;
		}
		count += ret;
	}
	return count;
}